

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O3

void __thiscall MarkerIndex::rotate_node_right(MarkerIndex *this,Node *rotation_pivot)

{
  Node *pNVar1;
  Node *pNVar2;
  Point PVar3;
  size_t sVar4;
  uint *puVar5;
  uint *__src;
  Node **ppNVar6;
  uint *puVar7;
  
  pNVar1 = rotation_pivot->parent;
  pNVar2 = pNVar1->parent;
  if (pNVar2 == (Node *)0x0) {
    ppNVar6 = &this->root;
  }
  else {
    ppNVar6 = &pNVar2->right;
    if (pNVar2->left == pNVar1) {
      ppNVar6 = &pNVar2->left;
    }
  }
  *ppNVar6 = rotation_pivot;
  rotation_pivot->parent = pNVar2;
  pNVar2 = rotation_pivot->right;
  pNVar1->left = pNVar2;
  if (pNVar2 != (Node *)0x0) {
    pNVar2->parent = pNVar1;
  }
  rotation_pivot->right = pNVar1;
  pNVar1->parent = rotation_pivot;
  PVar3 = Point::traversal(&pNVar1->left_extent,&rotation_pivot->left_extent);
  pNVar1->left_extent = PVar3;
  puVar7 = (pNVar1->left_marker_ids).contents.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar7 != (pNVar1->left_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      sVar4 = flat_set<unsigned_int>::count(&rotation_pivot->start_marker_ids,*puVar7);
      if (sVar4 == 0) {
        flat_set<unsigned_int>::insert(&rotation_pivot->left_marker_ids,*puVar7);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != (pNVar1->left_marker_ids).contents.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  puVar7 = (rotation_pivot->right_marker_ids).contents.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar7 != (rotation_pivot->right_marker_ids).contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      sVar4 = flat_set<unsigned_int>::count(&pNVar1->right_marker_ids,*puVar7);
      if (sVar4 == 0) {
        flat_set<unsigned_int>::insert(&pNVar1->left_marker_ids,*puVar7);
        __src = puVar7 + 1;
        puVar5 = (rotation_pivot->right_marker_ids).contents.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (__src != puVar5) {
          memmove(puVar7,__src,(long)puVar5 - (long)__src);
          puVar5 = (rotation_pivot->right_marker_ids).contents.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        puVar5 = puVar5 + -1;
        (rotation_pivot->right_marker_ids).contents.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
      }
      else {
        flat_set<unsigned_int>::erase(&pNVar1->right_marker_ids,*puVar7);
        puVar7 = puVar7 + 1;
        puVar5 = (rotation_pivot->right_marker_ids).contents.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
    } while (puVar7 != puVar5);
  }
  return;
}

Assistant:

void MarkerIndex::rotate_node_right(Node *rotation_pivot) {
  Node *rotation_root = rotation_pivot->parent;

  if (rotation_root->parent) {
    if (rotation_root->parent->left == rotation_root) {
      rotation_root->parent->left = rotation_pivot;
    } else {
      rotation_root->parent->right = rotation_pivot;
    }
  } else {
    root = rotation_pivot;
  }
  rotation_pivot->parent = rotation_root->parent;

  rotation_root->left = rotation_pivot->right;
  if (rotation_root->left) {
    rotation_root->left->parent = rotation_root;
  }

  rotation_pivot->right = rotation_root;
  rotation_root->parent = rotation_pivot;

  rotation_root->left_extent = rotation_root->left_extent.traversal(rotation_pivot->left_extent);

  for (auto it = rotation_root->left_marker_ids.begin(); it != rotation_root->left_marker_ids.end(); ++it) {
    if (!rotation_pivot->start_marker_ids.count(*it)) {
      rotation_pivot->left_marker_ids.insert(*it);
    }
  }

  for (auto it = rotation_pivot->right_marker_ids.begin(); it != rotation_pivot->right_marker_ids.end();) {
    if (rotation_root->right_marker_ids.count(*it)) {
      rotation_root->right_marker_ids.erase(*it);
      ++it;
    } else {
      rotation_root->left_marker_ids.insert(*it);
      it = rotation_pivot->right_marker_ids.erase(it);
    }
  }
}